

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractfileengine.cpp
# Opt level: O2

void __thiscall
QAbstractFileEnginePrivate::~QAbstractFileEnginePrivate(QAbstractFileEnginePrivate *this)

{
  this->_vptr_QAbstractFileEnginePrivate = (_func_int **)&PTR__QAbstractFileEnginePrivate_0017d888;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->errorString).d);
  return;
}

Assistant:

QAbstractFileEnginePrivate::~QAbstractFileEnginePrivate()
    = default;